

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O0

void __thiscall QPainter::drawPie(QPainter *this,QRectF *r,int a,int alen)

{
  bool bVar1;
  QPainterPrivate *this_00;
  undefined4 in_ECX;
  int in_EDX;
  qreal in_RSI;
  QPointF *in_RDI;
  long in_FS_OFFSET;
  QPainter *this_01;
  QPainterPath *this_02;
  QPainterPath *path_00;
  QPainterPrivate *d;
  QPainterPath path;
  QRectF rect;
  char *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  int line;
  QRectF *in_stack_ffffffffffffff68;
  QMessageLogger *in_stack_ffffffffffffff70;
  QPointF *this_03;
  QRectF local_48;
  char local_28 [32];
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_03 = in_RDI;
  this_00 = d_func((QPainter *)0x5992dd);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor> *)0x5992f3);
  if (bVar1) {
    if (in_EDX < 0x1681) {
      if ((in_EDX < 0) && (in_EDX = in_EDX % 0x1680, in_EDX < 0)) {
        in_EDX = in_EDX + 0x1680;
      }
    }
    else {
      in_EDX = in_EDX % 0x1680;
    }
    local_48.xp = -NAN;
    local_48.yp = -NAN;
    local_48.w = -NAN;
    local_48.h = -NAN;
    QRectF::normalized();
    QPainterPath::QPainterPath((QPainterPath *)0x5993c8);
    QRectF::center(in_stack_ffffffffffffff68);
    QPainterPath::moveTo((QPainterPath *)this_00,in_RDI);
    this_01 = (QPainter *)QRectF::x(&local_48);
    this_02 = (QPainterPath *)QRectF::y(&local_48);
    path_00 = (QPainterPath *)QRectF::width(&local_48);
    QRectF::height(&local_48);
    QPainterPath::arcTo((QPainterPath *)this_03,in_RSI,(qreal)CONCAT44(in_EDX,in_ECX),(qreal)this_00
                        ,(qreal)in_RDI,(qreal)this_01,(qreal)path_00);
    QPainterPath::closeSubpath(this_02);
    drawPath(this_01,path_00);
    QPainterPath::~QPainterPath((QPainterPath *)0x59948d);
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,line,
               in_stack_ffffffffffffff58);
    QMessageLogger::warning(local_28,"QPainter::drawPie: Painter not active");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPainter::drawPie(const QRectF &r, int a, int alen)
{
#ifdef QT_DEBUG_DRAW
    if (qt_show_painter_debug_output)
        printf("QPainter::drawPie(), [%.2f,%.2f,%.2f,%.2f], angle=%d, sweep=%d\n",
           r.x(), r.y(), r.width(), r.height(), a/16, alen/16);
#endif
    Q_D(QPainter);

    if (!d->engine) {
        qWarning("QPainter::drawPie: Painter not active");
        return;
    }

    if (a > (360*16)) {
        a = a % (360*16);
    } else if (a < 0) {
        a = a % (360*16);
        if (a < 0) a += (360*16);
    }

    QRectF rect = r.normalized();

    QPainterPath path;
    path.moveTo(rect.center());
    path.arcTo(rect.x(), rect.y(), rect.width(), rect.height(), a/16.0, alen/16.0);
    path.closeSubpath();
    drawPath(path);

}